

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

uint * __thiscall PrimitiveTestClass::FillValues<unsigned_int*>(PrimitiveTestClass *this)

{
  undefined1 auVar1 [16];
  uint *puVar2;
  ulong uVar3;
  long lVar4;
  long lVar5;
  int iVar7;
  undefined1 auVar6 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  int iVar11;
  
  lVar4 = (long)this->SIZE;
  uVar3 = 0xffffffffffffffff;
  if (-1 < lVar4) {
    uVar3 = lVar4 * 4;
  }
  puVar2 = (uint *)operator_new__(uVar3);
  auVar1 = _DAT_001360a0;
  if (lVar4 != 0) {
    lVar5 = lVar4 + -1;
    auVar6._8_4_ = (int)lVar5;
    auVar6._0_8_ = lVar5;
    auVar6._12_4_ = (int)((ulong)lVar5 >> 0x20);
    uVar3 = 0;
    auVar6 = auVar6 ^ _DAT_001360a0;
    auVar8 = _DAT_00136080;
    auVar9 = _DAT_00136090;
    do {
      auVar10 = auVar9 ^ auVar1;
      iVar7 = auVar6._4_4_;
      if ((bool)(~(auVar10._4_4_ == iVar7 && auVar6._0_4_ < auVar10._0_4_ || iVar7 < auVar10._4_4_)
                & 1)) {
        puVar2[uVar3] = 0xff;
      }
      if ((auVar10._12_4_ != auVar6._12_4_ || auVar10._8_4_ <= auVar6._8_4_) &&
          auVar10._12_4_ <= auVar6._12_4_) {
        puVar2[uVar3 + 1] = 0xff;
      }
      auVar10 = auVar8 ^ auVar1;
      iVar11 = auVar10._4_4_;
      if (iVar11 <= iVar7 && (iVar11 != iVar7 || auVar10._0_4_ <= auVar6._0_4_)) {
        puVar2[uVar3 + 2] = 0xff;
        puVar2[uVar3 + 3] = 0xff;
      }
      uVar3 = uVar3 + 4;
      lVar5 = auVar9._8_8_;
      auVar9._0_8_ = auVar9._0_8_ + 4;
      auVar9._8_8_ = lVar5 + 4;
      lVar5 = auVar8._8_8_;
      auVar8._0_8_ = auVar8._0_8_ + 4;
      auVar8._8_8_ = lVar5 + 4;
    } while ((lVar4 + 3U & 0xfffffffffffffffc) != uVar3);
  }
  return puVar2;
}

Assistant:

T FillValues()
        {
            T ret = new typename std::remove_pointer<T>::type[SIZE];
            for (size_t i = 0; i < SIZE; i++)
            {
                ret[i] = 0xFF;
            }
            
            return ret;
        }